

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O3

bool crnlib::command_line_params::split_params(char *p,dynamic_string_array *params)

{
  char c;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  dynamic_string str;
  dynamic_string local_40;
  
  local_40.m_buf_size = 0;
  local_40.m_len = 0;
  local_40.m_pStr = (char *)0x0;
  c = *p;
  bVar4 = false;
  if (c != '\0') {
    uVar3 = 1;
    bVar4 = false;
    bVar1 = false;
    do {
      if (bVar1) {
        if (bVar4) {
          if (c == '\"') {
            bVar4 = false;
          }
          dynamic_string::append_char(&local_40,c);
          bVar1 = true;
        }
        else if (c == '\t') {
LAB_0010e7f9:
          if (local_40.m_len != 0) {
            uVar2 = params->m_size;
            if (params->m_capacity <= uVar2) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)params,uVar2 + 1,true,0x10,(object_mover)0x0,false);
              uVar2 = params->m_size;
            }
            dynamic_string::dynamic_string(params->m_p + uVar2,&local_40);
            params->m_size = params->m_size + 1;
            dynamic_string::clear(&local_40);
          }
          bVar1 = false;
        }
        else {
          if (c == '\"') {
            bVar4 = true;
          }
          else if (c == ' ') goto LAB_0010e7f9;
          bVar1 = true;
          dynamic_string::append_char(&local_40,c);
        }
      }
      else {
        bVar1 = false;
        if ((c != '\t') && (c != ' ')) {
          if (c == '\"') {
            bVar4 = true;
          }
          bVar1 = true;
          dynamic_string::append_char(&local_40,c);
        }
      }
      c = p[uVar3];
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (c != '\0');
    if (bVar4) {
      console::error("Unmatched quote in command line \"%s\"",p);
    }
    else if (local_40.m_len != 0) {
      uVar2 = params->m_size;
      if (params->m_capacity <= uVar2) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)params,uVar2 + 1,true,0x10,(object_mover)0x0,false);
        uVar2 = params->m_size;
      }
      dynamic_string::dynamic_string(params->m_p + uVar2,&local_40);
      params->m_size = params->m_size + 1;
    }
    if ((local_40.m_pStr != (char *)0x0) &&
       ((*(uint *)(local_40.m_pStr + -8) ^ *(uint *)(local_40.m_pStr + -4)) == 0xffffffff)) {
      crnlib_free(local_40.m_pStr + -0x10);
    }
  }
  return (bool)~bVar4;
}

Assistant:

bool command_line_params::split_params(const char* p, dynamic_string_array& params)
    {
        bool within_param = false;
        bool within_quote = false;

        uint ofs = 0;
        dynamic_string str;

        while (p[ofs])
        {
            const char c = p[ofs];

            if (within_param)
            {
                if (within_quote)
                {
                    if (c == '"')
                    {
                        within_quote = false;
                    }
                    str.append_char(c);
                }
                else if ((c == ' ') || (c == '\t'))
                {
                    if (!str.is_empty())
                    {
                        params.push_back(str);
                        str.clear();
                    }
                    within_param = false;
                }
                else
                {
                    if (c == '"')
                    {
                        within_quote = true;
                    }
                    str.append_char(c);
                }
            }
            else if ((c != ' ') && (c != '\t'))
            {
                within_param = true;

                if (c == '"')
                {
                    within_quote = true;
                }

                str.append_char(c);
            }

            ofs++;
        }

        if (within_quote)
        {
            console::error("Unmatched quote in command line \"%s\"", p);
            return false;
        }

        if (!str.is_empty())
        {
            params.push_back(str);
        }
        return true;
    }